

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exactnns.h
# Opt level: O3

void __thiscall ExactNNS<float,_KBalls<float>_>::writeResult(ExactNNS<float,_KBalls<float>_> *this)

{
  float fVar1;
  pointer ppVar2;
  char cVar3;
  ostream *poVar4;
  long *plVar5;
  DistData<int> *pDVar6;
  ulong uVar7;
  priority_queue<DistDataMax<int>,_std::vector<DistDataMax<int>,_std::allocator<DistDataMax<int>_>_>,_std::less<DistDataMax<int>_>_>
  *this_00;
  ulong uVar8;
  ulong uVar9;
  vector<DistDataMax<int>,_std::allocator<DistDataMax<int>_>_> tempList;
  DistDataMax<int> kDist;
  string lshboxBenchFileName;
  ofstream lshboxFout;
  void *local_278;
  iterator iStack_270;
  DistDataMax<int> *local_268;
  DistData<int> local_260;
  char *local_258;
  long local_250;
  char local_248 [16];
  ExactNNS<float,_KBalls<float>_> *local_238;
  long local_230;
  filebuf local_228 [24];
  byte abStack_210 [216];
  ios_base local_138 [264];
  
  local_258 = local_248;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_258,"logs/nn.lshbox","");
  std::ofstream::ofstream(&local_230,(string *)&local_258,_S_out);
  if ((abStack_210[*(long *)(local_230 + -0x18)] & 5) != 0) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"cannot create output file ",0x1a);
    poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cout,local_258,local_250);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
    std::ostream::put((char)poVar4);
    std::ostream::flush();
  }
  poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)&local_230);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\t",1);
  plVar5 = (long *)std::ostream::operator<<(poVar4,this->topK_);
  std::ios::widen((char)*(undefined8 *)(*plVar5 + -0x18) + (char)plVar5);
  std::ostream::put((char)plVar5);
  std::ostream::flush();
  if ((this->maxHeaps_).
      super__Vector_base<std::priority_queue<DistDataMax<int>,_std::vector<DistDataMax<int>,_std::allocator<DistDataMax<int>_>_>,_std::less<DistDataMax<int>_>_>,_std::allocator<std::priority_queue<DistDataMax<int>,_std::vector<DistDataMax<int>,_std::allocator<DistDataMax<int>_>_>,_std::less<DistDataMax<int>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish !=
      (this->maxHeaps_).
      super__Vector_base<std::priority_queue<DistDataMax<int>,_std::vector<DistDataMax<int>,_std::allocator<DistDataMax<int>_>_>,_std::less<DistDataMax<int>_>_>,_std::allocator<std::priority_queue<DistDataMax<int>,_std::vector<DistDataMax<int>,_std::allocator<DistDataMax<int>_>_>,_std::less<DistDataMax<int>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    uVar9 = 0;
    local_238 = this;
    do {
      poVar4 = (ostream *)std::ostream::operator<<((ostream *)&local_230,(int)uVar9);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\t",1);
      ppVar2 = (this->maxHeaps_).
               super__Vector_base<std::priority_queue<DistDataMax<int>,_std::vector<DistDataMax<int>,_std::allocator<DistDataMax<int>_>_>,_std::less<DistDataMax<int>_>_>,_std::allocator<std::priority_queue<DistDataMax<int>,_std::vector<DistDataMax<int>,_std::allocator<DistDataMax<int>_>_>,_std::less<DistDataMax<int>_>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      local_278 = (void *)0x0;
      iStack_270._M_current = (DistDataMax<int> *)0x0;
      local_268 = (DistDataMax<int> *)0x0;
      pDVar6 = *(DistData<int> **)
                &ppVar2[uVar9].c.
                 super__Vector_base<DistDataMax<int>,_std::allocator<DistDataMax<int>_>_>._M_impl;
      if (*(DistData<int> **)
           ((long)&ppVar2[uVar9].c.
                   super__Vector_base<DistDataMax<int>,_std::allocator<DistDataMax<int>_>_>._M_impl
           + 8) == pDVar6) {
        uVar8 = 0;
      }
      else {
        this_00 = ppVar2 + uVar9;
        do {
          local_260 = *pDVar6;
          std::
          priority_queue<DistDataMax<int>,_std::vector<DistDataMax<int>,_std::allocator<DistDataMax<int>_>_>,_std::less<DistDataMax<int>_>_>
          ::pop(this_00);
          if (iStack_270._M_current == local_268) {
            std::vector<DistDataMax<int>,std::allocator<DistDataMax<int>>>::
            _M_realloc_insert<DistDataMax<int>const&>
                      ((vector<DistDataMax<int>,std::allocator<DistDataMax<int>>> *)&local_278,
                       iStack_270,(DistDataMax<int> *)&local_260);
          }
          else {
            (iStack_270._M_current)->super_DistData<int> = local_260;
            iStack_270._M_current = iStack_270._M_current + 1;
          }
          pDVar6 = &((this_00->c).
                     super__Vector_base<DistDataMax<int>,_std::allocator<DistDataMax<int>_>_>.
                     _M_impl.super__Vector_impl_data._M_start)->super_DistData<int>;
        } while (&((this_00->c).
                   super__Vector_base<DistDataMax<int>,_std::allocator<DistDataMax<int>_>_>._M_impl.
                   super__Vector_impl_data._M_finish)->super_DistData<int> != pDVar6);
        uVar8 = (ulong)((long)iStack_270._M_current - (long)local_278) >> 3 & 0xffffffff;
      }
      while( true ) {
        uVar8 = uVar8 - 1;
        if ((int)(uint)uVar8 < 0) break;
        uVar7 = (ulong)((uint)uVar8 & 0x7fffffff);
        fVar1 = *(float *)((long)local_278 + uVar7 * 8);
        poVar4 = (ostream *)
                 std::ostream::operator<<
                           ((ostream *)&local_230,*(int *)((long)local_278 + uVar7 * 8 + 4));
        std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\t",1);
        poVar4 = std::ostream::_M_insert<double>((double)fVar1);
        std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\t",1);
      }
      cVar3 = (char)(ostream *)&local_230;
      std::ios::widen((char)*(undefined8 *)(local_230 + -0x18) + cVar3);
      std::ostream::put(cVar3);
      std::ostream::flush();
      this = local_238;
      if (local_278 != (void *)0x0) {
        operator_delete(local_278);
      }
      uVar9 = uVar9 + 1;
    } while (uVar9 < (ulong)((long)(this->maxHeaps_).
                                   super__Vector_base<std::priority_queue<DistDataMax<int>,_std::vector<DistDataMax<int>,_std::allocator<DistDataMax<int>_>_>,_std::less<DistDataMax<int>_>_>,_std::allocator<std::priority_queue<DistDataMax<int>,_std::vector<DistDataMax<int>,_std::allocator<DistDataMax<int>_>_>,_std::less<DistDataMax<int>_>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_finish -
                             (long)(this->maxHeaps_).
                                   super__Vector_base<std::priority_queue<DistDataMax<int>,_std::vector<DistDataMax<int>,_std::allocator<DistDataMax<int>_>_>,_std::less<DistDataMax<int>_>_>,_std::allocator<std::priority_queue<DistDataMax<int>,_std::vector<DistDataMax<int>,_std::allocator<DistDataMax<int>_>_>,_std::less<DistDataMax<int>_>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start >> 5));
  }
  std::ofstream::close();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"lshbox groundtruth are written into ",0x24);
  poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&std::cout,local_258,local_250);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
  std::ostream::put((char)poVar4);
  std::ostream::flush();
  local_230 = _VTT;
  *(undefined8 *)(local_228 + *(long *)(_VTT + -0x18) + -8) = __filebuf;
  std::filebuf::~filebuf(local_228);
  std::ios_base::~ios_base(local_138);
  if (local_258 != local_248) {
    operator_delete(local_258);
  }
  return;
}

Assistant:

void ExactNNS<DataType, KMeansType>::writeResult() {
    string lshboxBenchFileName = "logs/nn.lshbox";
    // lshbox file
    ofstream lshboxFout(lshboxBenchFileName);
    if (!lshboxFout) {
        cout << "cannot create output file " << lshboxBenchFileName << endl;
    }
    lshboxFout << maxHeaps_.size() << "\t" << topK_ << endl;
    for (int query_id = 0; query_id < maxHeaps_.size(); ++query_id) {
        lshboxFout << query_id << "\t";
        priority_queue<DistDataMax<int > >& maxHeap = maxHeaps_[query_id];

        vector<DistDataMax<int> > tempList;
        while (maxHeap.size()>0) {
            DistDataMax<int> kDist = maxHeap.top();
            maxHeap.pop();
            tempList.push_back(kDist);
        }
        for (int i = tempList.size()-1; i >=0 ; --i) {
            DistDataMax<int> kDist = tempList[i];
            lshboxFout << kDist.data() << "\t" << kDist.dist() << "\t";
        }

        lshboxFout << endl;
    }
    lshboxFout.close();
    cout << "lshbox groundtruth are written into " << lshboxBenchFileName << endl;
}